

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Request::SetRequestType(Request *this)

{
  curl_mime *pcVar1;
  headers_t pcVar2;
  runtime_error *this_00;
  char *pcVar3;
  undefined8 uVar4;
  EasyHandle EVar5;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(this->request_type_) {
  case GET:
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = (char *)0x1;
    uVar4 = 0x50;
    break;
  case PUT:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = (char *)0x1;
    uVar4 = 0x2e;
    break;
  case POST:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    curl_easy_setopt(((this->eh_)._M_t.
                      super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                      .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_
                     ,0x2e,0);
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = (char *)0x1;
    uVar4 = 0x2f;
    break;
  case HEAD:
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = (char *)0x1;
    uVar4 = 0x2c;
    break;
  case DELETE:
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = "DELETE";
    goto LAB_0011db6a;
  case PATCH:
    pcVar2 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar2;
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = "PATCH";
    goto LAB_0011db6a;
  case OPTIONS:
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar3 = "OPTIONS";
LAB_0011db6a:
    uVar4 = 0x2734;
    break;
  case POST_MIME:
    if (this->mime_ == (curl_mime *)0x0) {
      pcVar1 = (curl_mime *)
               curl_mime_init(((this->eh_)._M_t.
                               super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                               .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)
                              ->handle_);
      this->mime_ = pcVar1;
    }
    pcVar3 = (char *)this->mime_;
    EVar5.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uVar4 = 0x281d;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_58,this->request_type_);
    std::operator+(&local_38,"Unsupported request type",&sStack_58);
    std::runtime_error::runtime_error(this_00,(string *)&local_38);
    *(undefined ***)this_00 = &PTR__runtime_error_0013e940;
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  curl_easy_setopt(EVar5.handle_,uVar4,pcVar3);
  return;
}

Assistant:

void SetRequestType() {
            switch(request_type_) {
                case RequestType::GET:
                    curl_easy_setopt(*eh_, CURLOPT_HTTPGET, 1L);
                    break;
                case RequestType::PUT:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 1L);
                    break;
                case RequestType::POST:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 0L);
                    curl_easy_setopt(*eh_, CURLOPT_POST, 1L);
                    break;
                case RequestType::HEAD:
                    curl_easy_setopt(*eh_, CURLOPT_NOBODY, 1L);
                    break;
                case RequestType::OPTIONS:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "OPTIONS");
                    break;
                case RequestType::PATCH:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "PATCH");
                    break;
                case RequestType::DELETE:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "DELETE");
                    break;
                case RequestType::POST_MIME:
                    InitMime();
                    curl_easy_setopt(*eh_, CURLOPT_MIMEPOST, mime_);
                    break;
                default:
                    throw Exception("Unsupported request type" + std::to_string(static_cast<int>(request_type_)));
            }
        }